

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IntegerLiteral * __thiscall
slang::BumpAllocator::
emplace<slang::ast::IntegerLiteral,slang::ast::Compilation&,slang::ast::Type_const&,slang::SVInt,bool,slang::SourceRange>
          (BumpAllocator *this,Compilation *args,Type *args_1,SVInt *args_2,bool *args_3,
          SourceRange *args_4)

{
  SourceRange sourceRange;
  IntegerLiteral *pIVar1;
  undefined1 unaff_retaddr;
  SVInt *in_stack_00000008;
  Type *in_stack_00000010;
  BumpAllocator *in_stack_00000018;
  IntegerLiteral *in_stack_00000020;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  pIVar1 = (IntegerLiteral *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sourceRange.endLoc = (SourceLocation)args_2;
  sourceRange.startLoc = (SourceLocation)args_3;
  ast::IntegerLiteral::IntegerLiteral
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
             (bool)unaff_retaddr,sourceRange);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }